

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# integerCoding.cpp
# Opt level: O2

size_t tinyusdz::Usd_IntegerCompression64::DecompressFromBuffer
                 (char *compressed,size_t compressedSize,uint64_t *ints,size_t numInts,string *err,
                 char *workingSpace)

{
  byte bVar1;
  size_t sVar2;
  pointer __p;
  long lVar3;
  int iVar4;
  long lVar5;
  uint64_t uVar6;
  long *plVar7;
  long lVar8;
  uint uVar9;
  byte *pbVar10;
  unique_ptr<char[],_std::default_delete<char[]>_> tmpSpace;
  
  sVar2 = anon_unknown_0::_GetEncodedBufferSize<int>(numInts);
  tmpSpace._M_t.super___uniq_ptr_impl<char,_std::default_delete<char[]>_>._M_t.
  super__Tuple_impl<0UL,_char_*,_std::default_delete<char[]>_>.super__Head_base<0UL,_char_*,_false>.
  _M_head_impl = (__uniq_ptr_data<char,_std::default_delete<char[]>,_true,_true>)
                 (__uniq_ptr_impl<char,_std::default_delete<char[]>_>)0x0;
  if (workingSpace == (char *)0x0) {
    __p = (pointer)operator_new__(sVar2);
    ::std::__uniq_ptr_impl<char,_std::default_delete<char[]>_>::reset
              ((__uniq_ptr_impl<char,_std::default_delete<char[]>_> *)&tmpSpace,__p);
    workingSpace = (char *)tmpSpace;
  }
  sVar2 = LZ4Compression::DecompressFromBuffer(compressed,workingSpace,compressedSize,sVar2,err);
  if (sVar2 == 0) {
    numInts = 0;
switchD_0026aedc_caseD_0:
    ::std::unique_ptr<char[],_std::default_delete<char[]>_>::~unique_ptr(&tmpSpace);
    return numInts;
  }
  lVar3 = *(long *)workingSpace;
  plVar7 = (long *)((long)workingSpace + (numInts * 2 + 7 >> 3) + 8);
  pbVar10 = (byte *)((long)workingSpace + 8);
  uVar6 = 0;
  sVar2 = numInts;
LAB_0026ae68:
  switch(sVar2) {
  case 0:
    break;
  case 1:
    switch(*pbVar10 & 3) {
    case 1:
      lVar3 = (long)(short)*plVar7;
      break;
    case 2:
      lVar3 = (long)(int)*plVar7;
      break;
    case 3:
      lVar3 = *plVar7;
    }
    *ints = lVar3 + uVar6;
    break;
  case 2:
    bVar1 = *pbVar10;
    for (lVar5 = 0; (int)lVar5 != 4; lVar5 = lVar5 + 2) {
      switch(bVar1 >> ((byte)lVar5 & 0x1f) & 3) {
      case 0:
        lVar8 = lVar3;
        break;
      case 1:
        lVar8 = *plVar7;
        plVar7 = (long *)((long)plVar7 + 2);
        lVar8 = (long)(short)lVar8;
        break;
      case 2:
        lVar8 = *plVar7;
        plVar7 = (long *)((long)plVar7 + 4);
        lVar8 = (long)(int)lVar8;
        break;
      case 3:
        lVar8 = *plVar7;
        plVar7 = plVar7 + 1;
      }
      uVar6 = uVar6 + lVar8;
      *(uint64_t *)((long)ints + lVar5 * 4) = uVar6;
    }
    break;
  case 3:
    bVar1 = *pbVar10;
    for (lVar5 = 0; (int)lVar5 != 6; lVar5 = lVar5 + 2) {
      uVar9 = (3 << ((byte)lVar5 & 0x1f) & (uint)bVar1) >> ((byte)lVar5 & 0x1f);
      if (uVar9 == 3) {
        lVar8 = *plVar7;
        plVar7 = plVar7 + 1;
      }
      else if (uVar9 == 2) {
        lVar8 = *plVar7;
        plVar7 = (long *)((long)plVar7 + 4);
        lVar8 = (long)(int)lVar8;
      }
      else {
        lVar8 = lVar3;
        if (uVar9 == 1) {
          lVar8 = *plVar7;
          plVar7 = (long *)((long)plVar7 + 2);
          lVar8 = (long)(short)lVar8;
        }
      }
      uVar6 = uVar6 + lVar8;
      *(uint64_t *)((long)ints + lVar5 * 4) = uVar6;
    }
    break;
  default:
    goto switchD_0026aedc_default;
  }
  goto switchD_0026aedc_caseD_0;
switchD_0026aedc_default:
  bVar1 = *pbVar10;
  for (iVar4 = 0; iVar4 != 8; iVar4 = iVar4 + 2) {
    uVar9 = (3 << ((byte)iVar4 & 0x1f) & (uint)bVar1) >> ((byte)iVar4 & 0x1f);
    if (uVar9 == 3) {
      lVar5 = *plVar7;
      plVar7 = plVar7 + 1;
    }
    else if (uVar9 == 2) {
      lVar5 = *plVar7;
      plVar7 = (long *)((long)plVar7 + 4);
      lVar5 = (long)(int)lVar5;
    }
    else {
      lVar5 = lVar3;
      if (uVar9 == 1) {
        lVar5 = *plVar7;
        plVar7 = (long *)((long)plVar7 + 2);
        lVar5 = (long)(short)lVar5;
      }
    }
    uVar6 = uVar6 + lVar5;
    *ints = uVar6;
    ints = ints + 1;
  }
  pbVar10 = pbVar10 + 1;
  sVar2 = sVar2 - 4;
  goto LAB_0026ae68;
}

Assistant:

size_t
Usd_IntegerCompression64::DecompressFromBuffer(
    char const *compressed, size_t compressedSize,
    uint64_t *ints, size_t numInts, std::string *err, char *workingSpace)
{
    return _DecompressIntegers(compressed, compressedSize,
                               ints, numInts, err, workingSpace);
}